

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

void Saig_ManBmcSupergateTest(Aig_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *vSuper;
  uint iPo;
  int level;
  void **__ptr;
  Aig_Man_t *pAVar3;
  
  pAVar3 = p;
  Abc_Print((int)p,"Supergates: ");
  level = (int)pAVar3;
  if (0 < p->nTruePos) {
    iPo = 0;
    do {
      if (p->vCos->nSize <= (int)iPo) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar3 = p;
      vSuper = Saig_ManBmcSupergate(p,iPo);
      uVar1 = vSuper->nSize;
      uVar2 = Saig_ManBmcCountRefed(pAVar3,vSuper);
      Abc_Print((int)pAVar3,"%d=%d(%d) ",(ulong)iPo,(ulong)uVar1,(ulong)uVar2);
      __ptr = vSuper->pArray;
      if (__ptr != (void **)0x0) {
        free(__ptr);
        vSuper->pArray = (void **)0x0;
      }
      level = (int)__ptr;
      if (vSuper != (Vec_Ptr_t *)0x0) {
        free(vSuper);
        level = (int)vSuper;
      }
      iPo = iPo + 1;
    } while ((int)iPo < p->nTruePos);
  }
  Abc_Print(level,"\n");
  return;
}

Assistant:

void Saig_ManBmcSupergateTest( Aig_Man_t * p )
{
    Vec_Ptr_t * vSuper;
    Aig_Obj_t * pObj;
    int i;
    Abc_Print( 1, "Supergates: " );
    Saig_ManForEachPo( p, pObj, i )
    {
        vSuper = Saig_ManBmcSupergate( p, i );
        Abc_Print( 1, "%d=%d(%d) ", i, Vec_PtrSize(vSuper), Saig_ManBmcCountRefed(p, vSuper) );
        Vec_PtrFree( vSuper );
    }
    Abc_Print( 1, "\n" );
}